

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagFallback(CodedInputStream *this)

{
  byte *pbVar1;
  int iVar2;
  uint32 uVar4;
  int iVar3;
  
  pbVar1 = this->buffer_;
  iVar3 = (int)this->buffer_end_;
  iVar2 = iVar3 - (int)pbVar1;
  if (9 < iVar2) {
LAB_0016bc6d:
    uVar4 = *pbVar1 & 0x7f;
    if ((char)*pbVar1 < '\0') {
      uVar4 = uVar4 | (pbVar1[1] & 0x7f) << 7;
      if ((char)pbVar1[1] < '\0') {
        uVar4 = uVar4 | (pbVar1[2] & 0x7f) << 0xe;
        if ((char)pbVar1[2] < '\0') {
          uVar4 = uVar4 | (pbVar1[3] & 0x7f) << 0x15;
          if ((char)pbVar1[3] < '\0') {
            uVar4 = uVar4 | (uint)pbVar1[4] << 0x1c;
            if ((char)pbVar1[4] < '\0') {
              pbVar1 = pbVar1 + 6;
              iVar2 = 5;
              while ((char)pbVar1[-1] < '\0') {
                pbVar1 = pbVar1 + 1;
                iVar2 = iVar2 + -1;
                if (iVar2 == 0) {
                  return 0;
                }
              }
            }
            else {
              pbVar1 = pbVar1 + 5;
            }
          }
          else {
            pbVar1 = pbVar1 + 4;
          }
        }
        else {
          pbVar1 = pbVar1 + 3;
        }
      }
      else {
        pbVar1 = pbVar1 + 2;
      }
    }
    else {
      pbVar1 = pbVar1 + 1;
    }
    this->buffer_ = pbVar1;
    return uVar4;
  }
  if (iVar2 < 1) {
    if (iVar3 == (int)pbVar1) {
      if (((0 < this->buffer_size_after_limit_) || (this->total_bytes_read_ == this->current_limit_)
          ) && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)
         ) {
        this->legitimate_message_end_ = true;
        return 0;
      }
    }
  }
  else if (-1 < (char)this->buffer_end_[-1]) goto LAB_0016bc6d;
  uVar4 = ReadTagSlow(this);
  return uVar4;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}